

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.h
# Opt level: O2

path * fs::u8path(path *__return_storage_ptr__,string *utf8_str)

{
  pointer pcVar1;
  long in_FS_OFFSET;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_60;
  path local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (utf8_str->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&local_60,pcVar1,pcVar1 + utf8_str->_M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            (&local_40,&local_60,auto_format);
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  std::__cxx11::u8string::~u8string((u8string *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static inline path u8path(const std::string& utf8_str)
{
    return std::filesystem::path(std::u8string{utf8_str.begin(), utf8_str.end()});
}